

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void al_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  _Bool _Var1;
  ALLEGRO_EVENT *src;
  ALLEGRO_EVENT *in_RSI;
  ALLEGRO_EVENT_QUEUE *in_RDI;
  ALLEGRO_EVENT *next_event;
  _AL_MUTEX *mutex;
  
  mutex = (_AL_MUTEX *)0x0;
  heartbeat();
  _al_mutex_lock((_AL_MUTEX *)0x1747d9);
  while( true ) {
    _Var1 = is_event_queue_empty(in_RDI);
    if (!_Var1) break;
    _al_cond_wait((_AL_COND *)&in_RSI->any,mutex);
  }
  if (in_RSI != (ALLEGRO_EVENT *)0x0) {
    src = get_next_event_if_any(in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
    copy_event(in_RSI,src);
  }
  _al_mutex_unlock((_AL_MUTEX *)0x17483c);
  return;
}

Assistant:

void al_wait_for_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event = NULL;

   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);
   {
      while (is_event_queue_empty(queue)) {
         _al_cond_wait(&queue->cond, &queue->mutex);
      }

      if (ret_event) {
         next_event = get_next_event_if_any(queue, true);
         copy_event(ret_event, next_event);
      }
   }
   _al_mutex_unlock(&queue->mutex);
}